

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

Sexp * GcHeap::AllocateCons(Sexp *car,Sexp *cdr)

{
  Sexp *pSVar1;
  Sexp *s;
  FrameProtector local_20;
  FrameProtector __frame_prot;
  Sexp *cdr_local;
  Sexp *car_local;
  
  __frame_prot.protected_frame = (Frame *)cdr;
  cdr_local = car;
  FrameProtector::FrameProtector(&local_20,"AllocateCons");
  FrameProtector::ProtectValue(&local_20,&cdr_local,"car");
  FrameProtector::ProtectValue(&local_20,(Sexp **)&__frame_prot,"cdr");
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0xbd,"static Sexp *GcHeap::AllocateCons(Sexp *, Sexp *)");
  }
  pSVar1 = Allocate(g_heap,false);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = CONS;
    (pSVar1->field_1).cons.car = cdr_local;
    (pSVar1->field_1).cons.cdr = (Sexp *)__frame_prot.protected_frame;
    FrameProtector::~FrameProtector(&local_20);
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0xbf,"static Sexp *GcHeap::AllocateCons(Sexp *, Sexp *)");
}

Assistant:

static Sexp *AllocateCons(Sexp *car, Sexp *cdr) {
    GC_HELPER_FRAME;
    GC_PROTECT(car);
    GC_PROTECT(cdr);

    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::CONS;
    s->cons.car = car;
    s->cons.cdr = cdr;
    return s;
  }